

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

QVariant * __thiscall QWizard::field(QWizard *this,QString *name)

{
  int iVar1;
  undefined8 uVar2;
  QString *in_RDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QWizardField *field;
  int index;
  QWizardPrivate *d;
  char *in_stack_ffffffffffffff88;
  QVariant *key;
  QMessageLogger *in_stack_ffffffffffffffa0;
  char local_30 [36];
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  key = in_RDI;
  d_func((QWizard *)0x7bb2cc);
  local_c = 0xffffffff;
  iVar1 = QMap<QString,_int>::value
                    ((QMap<QString,_int> *)in_stack_ffffffffffffffa0,(QString *)key,(int *)in_RDI);
  if (iVar1 == -1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffa0,(char *)key,(int)((ulong)in_RDI >> 0x20),
               in_stack_ffffffffffffff88);
    QtPrivate::asString(in_RDX);
    uVar2 = QString::utf16();
    QMessageLogger::warning(local_30,"QWizard::field: No such field \'%ls\'",uVar2);
    ::QVariant::QVariant((QVariant *)0x7bb34f);
  }
  else {
    QList<QWizardField>::at((QList<QWizardField> *)in_RDI,(qsizetype)in_stack_ffffffffffffff88);
    QByteArray::operator_cast_to_char_((QByteArray *)0x7bb396);
    QObject::property((char *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return key;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QWizard::field(const QString &name) const
{
    Q_D(const QWizard);

    int index = d->fieldIndexMap.value(name, -1);
    if (Q_UNLIKELY(index == -1)) {
        qWarning("QWizard::field: No such field '%ls'", qUtf16Printable(name));
        return QVariant();
    }

    const QWizardField &field = d->fields.at(index);
    return field.object->property(field.property);
}